

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Driver::LoadDataLine(RS_Driver *this,double *time,Actuation *activations)

{
  istream *this_00;
  reference this_01;
  reference pvVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  Actuation *activations_local;
  double *time_local;
  RS_Driver *this_local;
  
  std::istream::operator>>((istream *)this->m_ifs,time);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      this_00 = (istream *)this->m_ifs;
      this_01 = std::array<std::array<double,_8UL>,_4UL>::operator[](activations,(long)local_24);
      pvVar1 = std::array<double,_8UL>::operator[](this_01,(long)local_28);
      std::istream::operator>>(this_00,pvVar1);
    }
  }
  return;
}

Assistant:

void RS_Driver::LoadDataLine(double& time, Actuation& activations) {
    *m_ifs >> time;
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 8; j++) {
            *m_ifs >> activations[i][j];
        }
    }
}